

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_2dcf93::QualType::printLeft(QualType *this,OutputStream *S)

{
  uint uVar1;
  
  (*this->Child->_vptr_Node[4])();
  uVar1 = *(uint *)&(this->super_Node).field_0xc;
  if ((uVar1 & 1) != 0) {
    OutputStream::grow(S,6);
    builtin_strncpy(S->Buffer + S->CurrentPosition," const",6);
    S->CurrentPosition = S->CurrentPosition + 6;
    uVar1 = *(uint *)&(this->super_Node).field_0xc;
  }
  if ((uVar1 & 2) != 0) {
    OutputStream::grow(S,9);
    builtin_strncpy(S->Buffer + S->CurrentPosition," volatile",9);
    S->CurrentPosition = S->CurrentPosition + 9;
    uVar1 = *(uint *)&(this->super_Node).field_0xc;
  }
  if ((uVar1 & 4) != 0) {
    OutputStream::grow(S,9);
    builtin_strncpy(S->Buffer + S->CurrentPosition," restrict",9);
    S->CurrentPosition = S->CurrentPosition + 9;
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Child->printLeft(S);
    printQuals(S);
  }